

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

void Assimp::ConvertListToStrings
               (string *in,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  char *this;
  char *pcVar1;
  Logger *this_00;
  ulong uVar2;
  char **in_00;
  string local_80;
  allocator local_49;
  value_type local_48;
  char *local_28;
  char *base;
  char *s;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_local;
  string *in_local;
  
  s = (char *)out;
  out_local = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in;
  base = (char *)std::__cxx11::string::c_str();
  do {
    while( true ) {
      if (*base == '\0') {
        return;
      }
      SkipSpacesAndLineEnd<char>(&base);
      this = s;
      if (*base == '\'') break;
      GetNextToken_abi_cxx11_(&local_80,(Assimp *)&base,in_00);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    pcVar1 = base + 1;
    base = pcVar1;
    while (local_28 = pcVar1, *base != '\'') {
      base = base + 1;
      if (*base == '\0') {
        this_00 = DefaultLogger::get();
        Logger::error(this_00,"ConvertListToString: String list is ill-formatted");
        return;
      }
    }
    uVar2 = (long)base - (long)pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,uVar2,&local_49);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    base = base + 1;
  } while( true );
}

Assistant:

void ConvertListToStrings(const std::string& in, std::list<std::string>& out)
{
    const char* s = in.c_str();
    while (*s) {
        SkipSpacesAndLineEnd(&s);
        if (*s == '\'') {
            const char* base = ++s;
            while (*s != '\'') {
                ++s;
                if (*s == '\0') {
                    ASSIMP_LOG_ERROR("ConvertListToString: String list is ill-formatted");
                    return;
                }
            }
            out.push_back(std::string(base,(size_t)(s-base)));
            ++s;
        }
        else {
            out.push_back(GetNextToken(s));
        }
    }
}